

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

int __thiscall Preprocessor::evaluateCondition(Preprocessor *this)

{
  int iVar1;
  long in_FS_OFFSET;
  Parser local_78;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.symbols.d.d = (Data *)0x0;
  local_78.symbols.d.ptr = (Symbol *)0x0;
  local_78.symbols.d.size = 0;
  local_78.index = 0;
  local_78.displayWarnings = true;
  local_78.displayNotes = true;
  local_78.activeQtMode = false;
  local_78.qmlMacroWarningIsFatal = false;
  local_78._36_4_ = 0xaaaaaaaa;
  local_78.includes.d.d = (Data *)0x0;
  local_78.includes.d.ptr = (IncludePath *)0x0;
  local_78.includes.d.size = 0;
  local_78.currentFilenames.c.d.d = (Data *)0x0;
  local_78.currentFilenames.c.d.ptr = (QByteArray *)0x0;
  local_78.currentFilenames.c.d.size = 0;
  QArrayDataPointer<QByteArray>::operator=
            ((QArrayDataPointer<QByteArray> *)&local_78.currentFilenames,
             (QArrayDataPointer<QByteArray> *)&(this->super_Parser).currentFilenames);
  substituteUntilNewline(this,&local_78.symbols);
  iVar1 = PP_Expression::value((PP_Expression *)&local_78);
  Parser::~Parser(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int Preprocessor::evaluateCondition()
{
    PP_Expression expression;
    expression.currentFilenames = currentFilenames;

    substituteUntilNewline(expression.symbols);

    return expression.value();
}